

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

int __thiscall BoardView::EPCCheck(BoardView *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  element_type *peVar5;
  long in_RDI;
  float fVar6;
  shared_ptr<Point> *p_3;
  iterator __end2_2;
  iterator __begin2_2;
  SharedVector<Point> *__range2_2;
  shared_ptr<Point> *p_2;
  iterator __end2_1;
  iterator __begin2_1;
  SharedVector<Point> *__range2_1;
  ImVec2 intersect;
  Point *pb;
  Point *pa;
  size_t i;
  Point fp;
  int jump;
  int r;
  int l;
  shared_ptr<Pin> *p_1;
  iterator __end2;
  iterator __begin2;
  SharedVector<Pin> *__range2;
  shared_ptr<Point> *p;
  iterator __end1;
  iterator __begin1;
  SharedVector<Point> *__range1;
  ImVec2 max;
  ImVec2 min;
  SharedVector<Point> *outline;
  int side;
  int epc [2];
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  float fVar7;
  undefined4 in_stack_fffffffffffffef4;
  __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
  local_e0;
  vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *local_d8;
  reference local_d0;
  shared_ptr<Point> *local_c8;
  __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
  local_c0;
  vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *local_b8;
  ImVec2 local_b0;
  element_type *local_a8;
  element_type *local_a0;
  ulong local_98;
  element_type local_8c;
  int local_84;
  int local_80;
  int local_7c;
  reference local_78;
  shared_ptr<Pin> *local_70;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_68;
  undefined8 local_60;
  reference local_58;
  shared_ptr<Point> *local_50;
  __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
  local_48;
  vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *local_28;
  uint local_1c;
  uint local_18 [5];
  int local_4;
  
  memset(local_18,0,8);
  local_28 = (vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
             (**(code **)(**(long **)(in_RDI + 8) + 0x28))();
  ImVec2::ImVec2(&local_30);
  ImVec2::ImVec2(&local_38);
  bVar2 = std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::empty
                    ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (bVar2) {
    local_4 = 1;
  }
  else {
    local_30.y = 3.4028235e+38;
    local_30.x = 3.4028235e+38;
    local_38.y = 1.1754944e-38;
    local_38.x = 1.1754944e-38;
    local_40 = local_28;
    local_48._M_current =
         (shared_ptr<Point> *)
         std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::begin
                   ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_50 = (shared_ptr<Point> *)
               std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::end
                         ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>
                           *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
          bVar2) {
      local_58 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                 ::operator*(&local_48);
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11eb22);
      if (peVar5->x < local_30.x) {
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11eb41);
        local_30.x = peVar5->x;
      }
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11eb5b);
      if (peVar5->y < local_30.y) {
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11eb7b);
        local_30.y = peVar5->y;
      }
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11eb96);
      if (local_38.x < peVar5->x) {
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11ebb1);
        local_38.x = peVar5->x;
      }
      peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11ebcb);
      if (local_38.y < peVar5->y) {
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11ebe7);
        local_38.y = peVar5->y;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
      ::operator++(&local_48);
    }
    for (local_1c = 0; (int)local_1c < 2; local_1c = local_1c + 1) {
      local_60 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))();
      local_68._M_current =
           (shared_ptr<Pin> *)
           std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                     ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_70 = (shared_ptr<Pin> *)
                 std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                           ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
            bVar2) {
        local_78 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                   ::operator*(&local_68);
        local_84 = 1;
        Point::Point(&local_8c);
        local_7c = 0;
        local_80 = 0;
        for (local_98 = 0; uVar1 = local_98,
            sVar3 = std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::
                    size(local_28), uVar1 < sVar3 - 1; local_98 = local_98 + 1) {
          std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::operator[]
                    (local_28,local_98);
          local_a0 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator*((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::operator[]
                    (local_28,local_98 + 1);
          local_a8 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator*((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          uVar1 = local_98;
          if ((((local_a0->x != local_a8->x) || (NAN(local_a0->x) || NAN(local_a8->x))) ||
              (local_a0->y != local_a8->y)) || (NAN(local_a0->y) || NAN(local_a8->y))) {
            if (local_84 == 0) {
              if ((local_8c.x != local_a8->x) || (NAN(local_8c.x) || NAN(local_a8->x)))
              goto LAB_0011ee49;
              if ((local_8c.y != local_a8->y) || (NAN(local_8c.y) || NAN(local_a8->y)))
              goto LAB_0011ee49;
              sVar3 = std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>
                      ::size(local_28);
              if (uVar1 < sVar3 - 2) {
                std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::
                operator[](local_28,local_98 + 2);
                peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator*((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
                ;
                local_8c = *peVar5;
                local_84 = 1;
                local_98 = local_98 + 1;
              }
            }
            else {
LAB_0011ee49:
              local_84 = 0;
            }
            if ((((local_a8->y <= local_a0->y && local_a0->y != local_a8->y) &&
                 (peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                           operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x11ee7c), (peVar4->position).y < local_a0->y)) &&
                (peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x11eea0), fVar6 = (peVar4->position).y,
                local_a8->y <= fVar6 && fVar6 != local_a8->y)) ||
               (((local_a0->y < local_a8->y &&
                 (peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                           operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x11eee3), fVar6 = (peVar4->position).y,
                 local_a0->y <= fVar6 && fVar6 != local_a0->y)) &&
                (peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x11ef07), (peVar4->position).y < local_a8->y)))) {
              ImVec2::ImVec2(&local_b0);
              peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x11ef39);
              local_b0.y = (peVar4->position).y;
              if ((local_a0->x != local_a8->x) || (NAN(local_a0->x) || NAN(local_a8->x))) {
                fVar6 = (local_a8->x - local_a0->x) / (local_a8->y - local_a0->y);
                peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x11efbc);
                local_b0.x = fVar6 * ((peVar4->position).y - local_a0->y) + local_a0->x;
              }
              else {
                local_b0.x = local_a0->x;
              }
              fVar7 = local_b0.x;
              peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x11f007);
              fVar6 = local_b0.x;
              if (fVar7 < (peVar4->position).x || fVar7 == (peVar4->position).x) {
                peVar4 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x11f03f);
                if (fVar6 < (peVar4->position).x) {
                  local_7c = local_7c + 1;
                }
              }
              else {
                local_80 = local_80 + 1;
              }
            }
          }
        }
        if ((local_7c % 2 == 0) && (local_80 % 2 == 0)) {
          local_18[(int)local_1c] = local_18[(int)local_1c] + 1;
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
        ::operator++(&local_68);
      }
      if ((*(byte *)(in_RDI + 0xd1b8) & 1) != 0) {
        fprintf(_stderr,"EPC[%d]: %d\n",(ulong)local_1c,(ulong)local_18[(int)local_1c]);
      }
      local_b8 = local_28;
      local_c0._M_current =
           (shared_ptr<Point> *)
           std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::begin
                     ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_c8 = (shared_ptr<Point> *)
                 std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::end
                           ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>
                             *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                (__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
            bVar2) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                   ::operator*(&local_c0);
        in_stack_fffffffffffffee4 = local_38.y;
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11f178);
        fVar6 = in_stack_fffffffffffffee4 - peVar5->y;
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11f193);
        peVar5->y = fVar6;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
        ::operator++(&local_c0);
      }
    }
    if (((local_18[0] != 0) || (local_18[1] != 0)) && ((int)local_18[1] < (int)local_18[0])) {
      local_d8 = local_28;
      local_e0._M_current =
           (shared_ptr<Point> *)
           std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::begin
                     ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::end
                ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                (__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
            bVar2) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
        ::operator*(&local_e0);
        in_stack_fffffffffffffedc = local_38.y;
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11f256);
        in_stack_fffffffffffffee0 = in_stack_fffffffffffffedc - peVar5->y;
        peVar5 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x11f271);
        peVar5->y = in_stack_fffffffffffffee0;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
        ::operator++(&local_e0);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BoardView::EPCCheck(void) {
	int epc[2] = {0, 0};
	int side;
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	if (outline.empty()) {
		return 1;
	};

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (side = 0; side < 2; side++) {
		for (auto &p : m_board->Pins()) {
			// auto p = pin.get();
			int l, r;
			int jump = 1;
			Point fp;

			l = 0;
			r = 0;

			for (size_t i = 0; i < outline.size() - 1; i++) {
				Point &pa = *outline[i];
				Point &pb = *outline[i + 1];

				// jump double/dud points
				if (pa.x == pb.x && pa.y == pb.y) continue;

				// if we encounter our hull/poly start point, then we've now created the
				// closed
				// hull, jump the next segment and reset the first-point
				if ((!jump) && (fp.x == pb.x) && (fp.y == pb.y)) {
					if (i < outline.size() - 2) {
						fp   = *outline[i + 2];
						jump = 1;
						i++;
					}
				} else {
					jump = 0;
				}

				// test to see if this segment makes the scan-cut.
				if ((pa.y > pb.y && p->position.y < pa.y && p->position.y > pb.y) ||
				    (pa.y < pb.y && p->position.y > pa.y && p->position.y < pb.y)) {
					ImVec2 intersect;

					intersect.y = p->position.y;
					if (pa.x == pb.x)
						intersect.x = pa.x;
					else
						intersect.x = (pb.x - pa.x) / (pb.y - pa.y) * (p->position.y - pa.y) + pa.x;

					if (intersect.x > p->position.x)
						r++;
					else if (intersect.x < p->position.x)
						l++;
				}
			} // if we did get an intersection

			// If either side has no intersections, then it's out of bounds (likely)
			if ((l % 2 == 0) && (r % 2 == 0)) epc[side]++;
		} // pins

		if (debug) fprintf(stderr, "EPC[%d]: %d\n", side, epc[side]);

		// flip the outline
		for (auto &p : outline) p->y = max.y - p->y;

	} // side

	if ((epc[0] || epc[1]) && (epc[0] > epc[1])) {
		for (auto &p : outline) p->y = max.y - p->y;
	}

	return 0;
}